

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

size_t strlen_url(char *url,_Bool relative)

{
  bool bVar1;
  _Bool _Var2;
  undefined8 local_38;
  uchar *host_sep;
  size_t sStack_28;
  _Bool left;
  size_t newlen;
  uchar *ptr;
  _Bool relative_local;
  char *url_local;
  
  sStack_28 = 0;
  bVar1 = true;
  newlen = (size_t)url;
  local_38 = url;
  if (!relative) {
    local_38 = find_host_sep(url);
  }
  for (; *(char *)newlen != '\0'; newlen = newlen + 1) {
    if (newlen < local_38) {
      sStack_28 = sStack_28 + 1;
    }
    else if (*(char *)newlen == ' ') {
      if (bVar1) {
        sStack_28 = sStack_28 + 3;
      }
      else {
        sStack_28 = sStack_28 + 1;
      }
    }
    else {
      if (*(char *)newlen == '?') {
        bVar1 = false;
      }
      _Var2 = urlchar_needs_escaping((uint)*(byte *)newlen);
      if (_Var2) {
        sStack_28 = sStack_28 + 2;
      }
      sStack_28 = sStack_28 + 1;
    }
  }
  return sStack_28;
}

Assistant:

static size_t strlen_url(const char *url, bool relative)
{
  const unsigned char *ptr;
  size_t newlen = 0;
  bool left = TRUE; /* left side of the ? */
  const unsigned char *host_sep = (const unsigned char *) url;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(ptr = (unsigned char *)url; *ptr; ptr++) {

    if(ptr < host_sep) {
      ++newlen;
      continue;
    }

    switch(*ptr) {
    case '?':
      left = FALSE;
      /* FALLTHROUGH */
    default:
      if(urlchar_needs_escaping(*ptr))
        newlen += 2;
      newlen++;
      break;
    case ' ':
      if(left)
        newlen += 3;
      else
        newlen++;
      break;
    }
  }
  return newlen;
}